

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool CoreML::Specification::GlobalPooling3DLayerParams_GlobalPoolingType3D_IsValid(int value)

{
  return (uint)value < 2;
}

Assistant:

bool GlobalPooling3DLayerParams_GlobalPoolingType3D_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
      return true;
    default:
      return false;
  }
}